

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_open1(archive *_a)

{
  archive_string_conv **ppaVar1;
  long lVar2;
  undefined8 *puVar3;
  archive_read_filter *paVar4;
  code *pcVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  archive_read_filter *paVar10;
  void *pvVar11;
  archive_string_conv **ppaVar12;
  archive_read_filter *paVar13;
  char *fmt;
  long lVar14;
  archive_read_filter *self;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  long local_38;
  
  iVar7 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar7 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].compression_name == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
    _a->state = 0x8000;
    return -0x1e;
  }
  if ((*(code **)&_a[1].compression_code != (code *)0x0) &&
     (iVar7 = (**(code **)&_a[1].compression_code)
                        (_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + 0x10)), iVar7 != 0))
  {
    if (_a[1].error_string.s == (char *)0x0) {
      return iVar7;
    }
    if ((int)_a[1].error_string.buffer_length == 0) {
      return iVar7;
    }
    lVar18 = 0x10;
    uVar16 = 0;
    do {
      (*(code *)_a[1].error_string.s)(_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + lVar18))
      ;
      uVar16 = uVar16 + 1;
      lVar18 = lVar18 + 0x18;
    } while (uVar16 < (uint)_a[1].error_string.buffer_length);
    return iVar7;
  }
  paVar10 = (archive_read_filter *)calloc(1,0xb0);
  if (paVar10 == (archive_read_filter *)0x0) {
    return -0x1e;
  }
  paVar10->archive = (archive_read *)_a;
  puVar3 = *(undefined8 **)&_a[1].current_codepage;
  paVar10->data = (void *)puVar3[2];
  paVar10->open = client_open_proxy;
  paVar10->read = client_read_proxy;
  paVar10->skip = client_skip_proxy;
  paVar10->seek = client_seek_proxy;
  paVar10->close = client_close_proxy;
  paVar10->sswitch = client_switch_proxy;
  paVar10->name = "none";
  *puVar3 = 0;
  self = (archive_read_filter *)_a[6].error_string.length;
  if ((self == (archive_read_filter *)0x0) ||
     (paVar4 = self, (int)_a[6].error_string.buffer_length == 0)) {
    _a[6].error_string.length = (size_t)paVar10;
    iVar7 = 0;
    do {
      lVar14 = 0;
      lVar18 = 0;
      iVar9 = 0;
      do {
        pcVar5 = *(code **)((long)&_a[1].read_data_offset + lVar14);
        if (pcVar5 != (code *)0x0) {
          lVar2 = (long)&_a[1].sconv + lVar14;
          iVar8 = (*pcVar5)(lVar2,_a[6].error_string.length);
          if (iVar9 < iVar8) {
            lVar18 = lVar2;
            iVar9 = iVar8;
          }
        }
        lVar14 = lVar14 + 0x30;
      } while ((int)lVar14 != 0x300);
      if (lVar18 == 0) {
        __archive_read_filter_ahead((archive_read_filter *)_a[6].error_string.length,1,&local_38);
        if (local_38 < 0) {
LAB_00490a68:
          __archive_read_free_filters((archive_read *)_a);
          goto LAB_00490b54;
        }
        self = (archive_read_filter *)_a[6].error_string.length;
        _a->compression_name = self->name;
        _a->compression_code = self->code;
        goto LAB_00490a49;
      }
      pvVar11 = calloc(1,0xb0);
      if (pvVar11 == (void *)0x0) goto LAB_00490b54;
      *(long *)((long)pvVar11 + 8) = lVar18;
      *(archive **)((long)pvVar11 + 0x18) = _a;
      *(size_t *)((long)pvVar11 + 0x10) = _a[6].error_string.length;
      _a[6].error_string.length = (size_t)pvVar11;
      iVar9 = (**(code **)(lVar18 + 0x18))(pvVar11);
      if (iVar9 != 0) goto LAB_00490a68;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x19);
    archive_set_error(_a,0x54,"Input requires too many filters for decoding");
  }
  else {
    do {
      paVar13 = paVar4;
      paVar4 = paVar13->upstream;
    } while (paVar4 != (archive_read_filter *)0x0);
    paVar13->upstream = paVar10;
LAB_00490a49:
    if (_a[0xf].error_string.length != 0) {
LAB_00490a53:
      _a->state = 2;
      client_switch_proxy(self,0);
      return 0;
    }
    ppaVar1 = &_a[6].sconv;
    _a[0xf].error_string.length = (size_t)ppaVar1;
    uVar17 = 0;
    uVar15 = 0xffffffff;
    iVar7 = -1;
    ppaVar12 = ppaVar1;
    do {
      if (ppaVar12[2] != (archive_string_conv *)0x0) {
        iVar9 = (*(code *)ppaVar12[2])(_a);
        if (iVar9 == -0x1e) goto LAB_00490b48;
        paVar10 = (archive_read_filter *)_a[6].error_string.length;
        if (paVar10->position != 0) {
          __archive_read_filter_seek(paVar10,0,0);
        }
        uVar6 = uVar17;
        if (-1 < (int)uVar15 && iVar9 <= iVar7) {
          uVar6 = uVar15;
          iVar9 = iVar7;
        }
        uVar15 = uVar6;
        ppaVar12 = (archive_string_conv **)_a[0xf].error_string.length;
        iVar7 = iVar9;
      }
      uVar17 = uVar17 + 1;
      ppaVar12 = ppaVar12 + 0xb;
      _a[0xf].error_string.length = (size_t)ppaVar12;
    } while (uVar17 != 0x10);
    if ((int)uVar15 < 0) {
      fmt = "No formats registered";
    }
    else {
      if (0 < iVar7) {
        _a[0xf].error_string.length = (size_t)(ppaVar1 + (ulong)uVar15 * 0xb);
        self = (archive_read_filter *)_a[6].error_string.length;
        goto LAB_00490a53;
      }
      fmt = "Unrecognized archive format";
    }
    archive_set_error(_a,0x54,fmt);
LAB_00490b48:
    close_filters((archive_read *)_a[6].error_string.length);
  }
LAB_00490b54:
  _a->state = 0x8000;
  return -0x1e;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}